

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i8255.hpp
# Opt level: O0

void __thiscall
Intel::i8255::i8255<AmstradCPC::i8255PortHandler>::update_outputs
          (i8255<AmstradCPC::i8255PortHandler> *this)

{
  i8255<AmstradCPC::i8255PortHandler> *this_local;
  
  if ((this->control_ & 0x10) == 0) {
    AmstradCPC::i8255PortHandler::set_value(this->port_handler_,0,this->outputs_[0]);
  }
  if ((this->control_ & 2) == 0) {
    AmstradCPC::i8255PortHandler::set_value(this->port_handler_,1,this->outputs_[1]);
  }
  AmstradCPC::i8255PortHandler::set_value(this->port_handler_,2,this->outputs_[2]);
  return;
}

Assistant:

void update_outputs() {
			if(!(control_ & 0x10)) port_handler_.set_value(0, outputs_[0]);
			if(!(control_ & 0x02)) port_handler_.set_value(1, outputs_[1]);
			port_handler_.set_value(2, outputs_[2]);
		}